

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  ITracker *pIVar1;
  _Alloc_hider _Var2;
  NameAndLocation local_80;
  undefined1 local_50 [20];
  undefined2 uStack_3c;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  char *local_30;
  undefined8 local_28;
  
  local_80.location.file._4_2_ = 0x7d74;
  local_80.location.file._6_1_ = 0;
  local_50._16_4_ = 0x6f6f727b;
  uStack_3c = 0x7d74;
  uStack_3a = 0;
  uStack_39 = local_80.location.file._7_1_;
  local_50._8_8_ = (ITracker *)0x6;
  local_80.name.field_2._8_8_ = 0;
  local_80.location.file._0_4_ = 0x6f6f7200;
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp"
  ;
  local_28 = 0x1a34;
  local_80.name._M_string_length = 0;
  local_80.name.field_2._M_allocated_capacity = (size_type)&local_80.location;
  local_50._0_8_ = (ITracker *)(local_50 + 0x10);
  Detail::
  make_unique<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,decltype(nullptr)>
            (&local_80,(TrackerContext *)local_50,(void **)this);
  _Var2._M_p = local_80.name._M_dataplus._M_p;
  local_80.name._M_dataplus._M_p = (pointer)0x0;
  pIVar1 = (this->m_rootTracker).m_ptr;
  if (pIVar1 == (ITracker *)0x0) {
    (this->m_rootTracker).m_ptr = (ITracker *)_Var2._M_p;
  }
  else {
    (*pIVar1->_vptr_ITracker[1])();
    (this->m_rootTracker).m_ptr = (ITracker *)_Var2._M_p;
    if ((long *)local_80.name._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_80.name._M_dataplus._M_p + 8))();
    }
  }
  if ((ITracker *)local_50._0_8_ != (ITracker *)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_,
                    CONCAT17(uStack_39,CONCAT16(uStack_3a,CONCAT24(uStack_3c,local_50._16_4_))) + 1)
    ;
  }
  if ((SourceLineInfo *)local_80.name.field_2._M_allocated_capacity != &local_80.location) {
    operator_delete((void *)local_80.name.field_2._M_allocated_capacity,
                    CONCAT17(local_80.location.file._7_1_,
                             CONCAT16(local_80.location.file._6_1_,
                                      CONCAT24(local_80.location.file._4_2_,
                                               local_80.location.file._0_4_))) + 1);
  }
  this->m_currentTracker = (ITracker *)0x0;
  this->m_runState = Executing;
  return (this->m_rootTracker).m_ptr;
}

Assistant:

ITracker& TrackerContext::startRun() {
        using namespace std::string_literals;
        m_rootTracker = Catch::Detail::make_unique<SectionTracker>(
            NameAndLocation( "{root}"s, CATCH_INTERNAL_LINEINFO ),
            *this,
            nullptr );
        m_currentTracker = nullptr;
        m_runState = Executing;
        return *m_rootTracker;
    }